

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsRouter.cpp
# Opt level: O2

long __thiscall AmsRouter::AddRoute(AmsRouter *this,AmsNetId ams,string *host)

{
  long *plVar1;
  _Hash_node_base _Var2;
  mapped_type pAVar3;
  bool bVar4;
  AmsConnection *this_00;
  mapped_type *ppAVar5;
  __uniq_ptr_data<AmsConnection,_std::default_delete<AmsConnection>,_true,_true> this_01;
  _Node_iterator<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_true,_false>
  _Var6;
  ulong uVar7;
  __node_base *p_Var8;
  pair<std::__detail::_Node_iterator<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_true,_false>,_bool>
  pVar9;
  AmsNetId ams_local;
  unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_> new_connection;
  AmsNetId local_5e;
  AddressList hostAddresses;
  unique_lock<std::recursive_mutex> lock;
  
  ams_local.b._0_4_ = ams.b._0_4_;
  ams_local.b._4_2_ = ams.b._4_2_;
  std::__cxx11::string::string((string *)&lock,"48898",(allocator *)&new_connection);
  bhf::ads::GetListOfAddresses((ads *)&hostAddresses,host,(string *)&lock);
  std::__cxx11::string::~string((string *)&lock);
  std::unique_lock<std::recursive_mutex>::unique_lock(&lock,&this->mutex);
  AwaitConnectionAttempts(this,&ams_local,&lock);
  this_00 = GetConnection(this,&ams_local);
  if (this_00 != (AmsConnection *)0x0) {
    bVar4 = AmsConnection::IsConnectedTo
                      (this_00,hostAddresses._M_t.
                               super___uniq_ptr_impl<addrinfo,_void_(*)(addrinfo_*)>._M_t.
                               super__Tuple_impl<0UL,_addrinfo_*,_void_(*)(addrinfo_*)>.
                               super__Head_base<0UL,_addrinfo_*,_false>._M_head_impl);
    uVar7 = 0x506;
    if (!bVar4) goto LAB_00132f37;
  }
  p_Var8 = &(this->connections)._M_h._M_before_begin;
  do {
    p_Var8 = p_Var8->_M_nxt;
    if (p_Var8 == (__node_base *)0x0) {
      std::
      map<AmsNetId,_std::tuple<>,_std::less<AmsNetId>,_std::allocator<std::pair<const_AmsNetId,_std::tuple<>_>_>_>
      ::operator[](&this->connection_attempts,&ams_local);
      std::unique_lock<std::recursive_mutex>::unlock(&lock);
      this_01.super___uniq_ptr_impl<AmsConnection,_std::default_delete<AmsConnection>_>._M_t.
      super__Tuple_impl<0UL,_AmsConnection_*,_std::default_delete<AmsConnection>_>.
      super__Head_base<0UL,_AmsConnection_*,_false>._M_head_impl =
           (__uniq_ptr_impl<AmsConnection,_std::default_delete<AmsConnection>_>)operator_new(0x3918)
      ;
      AmsConnection::AmsConnection
                ((AmsConnection *)
                 this_01.super___uniq_ptr_impl<AmsConnection,_std::default_delete<AmsConnection>_>.
                 _M_t.super__Tuple_impl<0UL,_AmsConnection_*,_std::default_delete<AmsConnection>_>.
                 super__Head_base<0UL,_AmsConnection_*,_false>._M_head_impl,&this->super_Router,
                 hostAddresses._M_t.super___uniq_ptr_impl<addrinfo,_void_(*)(addrinfo_*)>._M_t.
                 super__Tuple_impl<0UL,_addrinfo_*,_void_(*)(addrinfo_*)>.
                 super__Head_base<0UL,_addrinfo_*,_false>._M_head_impl);
      new_connection._M_t.super___uniq_ptr_impl<AmsConnection,_std::default_delete<AmsConnection>_>.
      _M_t.super__Tuple_impl<0UL,_AmsConnection_*,_std::default_delete<AmsConnection>_>.
      super__Head_base<0UL,_AmsConnection_*,_false>._M_head_impl =
           (__uniq_ptr_data<AmsConnection,_std::default_delete<AmsConnection>,_true,_true>)
           (__uniq_ptr_data<AmsConnection,_std::default_delete<AmsConnection>,_true,_true>)
           this_01.super___uniq_ptr_impl<AmsConnection,_std::default_delete<AmsConnection>_>._M_t.
           super__Tuple_impl<0UL,_AmsConnection_*,_std::default_delete<AmsConnection>_>.
           super__Head_base<0UL,_AmsConnection_*,_false>._M_head_impl;
      std::unique_lock<std::recursive_mutex>::lock(&lock);
      std::
      _Rb_tree<AmsNetId,_std::pair<const_AmsNetId,_std::tuple<>_>,_std::_Select1st<std::pair<const_AmsNetId,_std::tuple<>_>_>,_std::less<AmsNetId>,_std::allocator<std::pair<const_AmsNetId,_std::tuple<>_>_>_>
      ::erase(&(this->connection_attempts)._M_t,&ams_local);
      std::_V2::condition_variable_any::notify_all(&this->connection_attempt_events);
      pVar9 = std::
              _Hashtable<std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>,std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>,std::allocator<std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>>,std::__detail::_Identity,std::equal_to<std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>>,std::hash<std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::_M_emplace<std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>>
                        ((_Hashtable<std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>,std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>,std::allocator<std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>>,std::__detail::_Identity,std::equal_to<std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>>,std::hash<std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)&this->connections,&new_connection);
      _Var6 = pVar9.first.
              super__Node_iterator_base<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_false>
              ._M_cur;
      if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        uVar7 = 0xffffffffffffffff;
      }
      else {
        bVar4 = AmsNetId::operator_cast_to_bool(&this->localAddr);
        if (!bVar4) {
          AmsNetId::AmsNetId(&local_5e,
                             *(uint32_t *)
                              (*(long *)((long)_Var6.
                                               super__Node_iterator_base<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_false>
                                               ._M_cur + 8) + 0x3910));
          *(undefined2 *)((this->localAddr).b + 4) = local_5e.b._4_2_;
          *(undefined4 *)(this->localAddr).b = local_5e.b._0_4_;
        }
        LOCK();
        plVar1 = (long *)(*(long *)((long)_Var6.
                                          super__Node_iterator_base<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_false>
                                          ._M_cur + 8) + 0xa8);
        *plVar1 = *plVar1 + 1;
        UNLOCK();
        pAVar3 = *(mapped_type *)
                  ((long)_Var6.
                         super__Node_iterator_base<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_false>
                         ._M_cur + 8);
        ppAVar5 = std::
                  map<AmsNetId,_AmsConnection_*,_std::less<AmsNetId>,_std::allocator<std::pair<const_AmsNetId,_AmsConnection_*>_>_>
                  ::operator[](&this->mapping,&ams_local);
        *ppAVar5 = pAVar3;
        uVar7 = (ulong)(*(int *)(*(long *)((long)_Var6.
                                                 super__Node_iterator_base<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_false>
                                                 ._M_cur + 8) + 0x3910) == 0);
      }
      std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>::~unique_ptr
                (&new_connection);
      goto LAB_00132f37;
    }
    bVar4 = AmsConnection::IsConnectedTo
                      ((AmsConnection *)p_Var8[1]._M_nxt,
                       hostAddresses._M_t.super___uniq_ptr_impl<addrinfo,_void_(*)(addrinfo_*)>._M_t
                       .super__Tuple_impl<0UL,_addrinfo_*,_void_(*)(addrinfo_*)>.
                       super__Head_base<0UL,_addrinfo_*,_false>._M_head_impl);
  } while (!bVar4);
  LOCK();
  p_Var8[1]._M_nxt[0x15]._M_nxt =
       (_Hash_node_base *)((long)&(p_Var8[1]._M_nxt[0x15]._M_nxt)->_M_nxt + 1);
  UNLOCK();
  _Var2._M_nxt = p_Var8[1]._M_nxt;
  ppAVar5 = std::
            map<AmsNetId,_AmsConnection_*,_std::less<AmsNetId>,_std::allocator<std::pair<const_AmsNetId,_AmsConnection_*>_>_>
            ::operator[](&this->mapping,&ams_local);
  *ppAVar5 = (mapped_type)_Var2._M_nxt;
  uVar7 = 0;
LAB_00132f37:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&lock);
  std::unique_ptr<addrinfo,_void_(*)(addrinfo_*)>::~unique_ptr(&hostAddresses);
  return uVar7;
}

Assistant:

long AmsRouter::AddRoute(AmsNetId ams, const std::string& host)
{
    /**
        DNS lookups are pretty time consuming, we shouldn't do them
        with a looked mutex! So instead we do the lookup first and
        use the results, later.
     */
    auto hostAddresses = bhf::ads::GetListOfAddresses(host, "48898");

    std::unique_lock<std::recursive_mutex> lock(mutex);

    AwaitConnectionAttempts(ams, lock);

    const auto oldConnection = GetConnection(ams);
    if (oldConnection && !oldConnection->IsConnectedTo(hostAddresses.get())) {
        /**
           There is already a route for this AmsNetId, but with
           a different IP. The old route has to be deleted, first!
         */
        return ROUTERERR_PORTALREADYINUSE;
    }

    for (const auto& conn : connections) {
        if (conn->IsConnectedTo(hostAddresses.get())) {
            conn->refCount++;
            mapping[ams] = conn.get();
            return 0;
        }
    }

    connection_attempts[ams] = {};
    lock.unlock();

    try {
        auto new_connection = std::unique_ptr<AmsConnection>(new AmsConnection { *this, hostAddresses.get()});
        lock.lock();
        connection_attempts.erase(ams);
        connection_attempt_events.notify_all();

        auto conn = connections.emplace(std::move(new_connection));
        if (conn.second) {
            /** in case no local AmsNetId was set previously, we derive one */
            if (!localAddr) {
                localAddr = AmsNetId {conn.first->get()->ownIp};
            }
            conn.first->get()->refCount++;
            mapping[ams] = conn.first->get();
            return !conn.first->get()->ownIp;
        }

        return -1;
    } catch (std::exception& e) {
        lock.lock();
        connection_attempts.erase(ams);
        connection_attempt_events.notify_all();
        throw e;
    }
}